

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O3

void draco::parser::SkipCharacters(DecoderBuffer *buffer,char *skip_chars)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  if (skip_chars != (char *)0x0) {
    sVar2 = strlen(skip_chars);
    lVar4 = buffer->pos_ + 1;
    if ((lVar4 <= buffer->data_size_) && (0 < (int)(uint)sVar2)) {
      lVar3 = buffer->pos_;
      do {
        uVar5 = 0;
        while (buffer->data_[lVar3] != skip_chars[uVar5]) {
          uVar5 = uVar5 + 1;
          if (((uint)sVar2 & 0x7fffffff) == uVar5) {
            return;
          }
        }
        buffer->pos_ = lVar4;
        lVar1 = lVar4 + 1;
        lVar3 = lVar4;
        lVar4 = lVar1;
      } while (lVar1 <= buffer->data_size_);
    }
  }
  return;
}

Assistant:

void SkipCharacters(DecoderBuffer *buffer, const char *skip_chars) {
  if (skip_chars == nullptr) {
    return;
  }
  const int num_skip_chars = static_cast<int>(strlen(skip_chars));
  char c;
  while (buffer->Peek(&c)) {
    // Check all characters in the pattern.
    bool skip = false;
    for (int i = 0; i < num_skip_chars; ++i) {
      if (c == skip_chars[i]) {
        skip = true;
        break;
      }
    }
    if (!skip) {
      return;
    }
    buffer->Advance(1);
  }
}